

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallGetRuntimeDependenciesGenerator::GenerateScript
          (cmInstallGetRuntimeDependenciesGenerator *this,ostream *os)

{
  __type _Var1;
  cmScriptGeneratorIndent cVar2;
  ostream *poVar3;
  ulong uVar4;
  string local_90;
  string local_70;
  string local_40;
  int local_20;
  cmScriptGeneratorIndent local_1c;
  ostream *poStack_18;
  Indent indent;
  ostream *os_local;
  cmInstallGetRuntimeDependenciesGenerator *this_local;
  
  poStack_18 = os;
  cmScriptGeneratorIndent::cmScriptGeneratorIndent(&local_1c);
  local_20 = local_1c.Level;
  poVar3 = ::operator<<(poStack_18,local_1c);
  std::operator<<(poVar3,"if(");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    _Var1 = std::operator==(&this->FrameworkComponent,&this->LibraryComponent);
    poVar3 = poStack_18;
    if (!_Var1) {
      cmInstallGenerator::CreateComponentTest
                (&local_70,&this->super_cmInstallGenerator,&this->LibraryComponent,true,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_70);
      poVar3 = std::operator<<(poVar3," OR ");
      cmInstallGenerator::CreateComponentTest
                (&local_90,&this->super_cmInstallGenerator,&this->FrameworkComponent,
                 (bool)((this->super_cmInstallGenerator).ExcludeFromAll & 1),false);
      std::operator<<(poVar3,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_007b8a7d;
    }
  }
  poVar3 = poStack_18;
  cmInstallGenerator::CreateComponentTest
            (&local_40,&this->super_cmInstallGenerator,&this->LibraryComponent,
             (bool)((this->super_cmInstallGenerator).ExcludeFromAll & 1),false);
  std::operator<<(poVar3,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
LAB_007b8a7d:
  std::operator<<(poStack_18,")\n");
  poVar3 = poStack_18;
  cVar2 = cmScriptGeneratorIndent::Next(&local_1c,2);
  (*(this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator[3])
            (this,poVar3,(ulong)(uint)cVar2.Level);
  poVar3 = ::operator<<(poStack_18,local_1c);
  std::operator<<(poVar3,"endif()\n\n");
  return;
}

Assistant:

void cmInstallGetRuntimeDependenciesGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  os << indent << "if(";
  if (this->FrameworkComponent.empty() ||
      this->FrameworkComponent == this->LibraryComponent) {
    os << this->CreateComponentTest(this->LibraryComponent,
                                    this->ExcludeFromAll);
  } else {
    os << this->CreateComponentTest(this->LibraryComponent, true) << " OR "
       << this->CreateComponentTest(this->FrameworkComponent,
                                    this->ExcludeFromAll);
  }
  os << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}